

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborstreamreader.h
# Opt level: O2

quint64 __thiscall QCborStreamReader::length(QCborStreamReader *this)

{
  long lVar1;
  undefined4 uVar2;
  
  lVar1 = *(long *)(this + 8);
  uVar2 = 0x104;
  if (((uint)(byte)this[0x10] << 0x1b | (byte)this[0x10] - 0x40 >> 5) < 4) {
    if ((*(byte *)(lVar1 + 0x5f) & 0x10) == 0) {
      return *(quint64 *)this;
    }
    uVar2 = 2;
  }
  *(undefined1 *)(lVar1 + 0x70) = 1;
  *(undefined4 *)(lVar1 + 0x60) = uVar2;
  return 0xffffffffffffffff;
}

Assistant:

Type type() const               { return QCborStreamReader::Type(type_); }